

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawThings(void)

{
  double scale;
  int iVar1;
  uint uVar2;
  spritedef_t *psVar3;
  AMColor *pAVar4;
  mline_t *lineguy;
  bool bVar5;
  int local_134;
  uint local_124;
  TAngle<double> local_118;
  TAngle<double> local_110;
  TAngle<double> local_108;
  TFlags<ActorFlag,_unsigned_int> local_fc;
  TAngle<double> local_f8;
  uint local_f0;
  TFlags<ActorFlag,_unsigned_int> local_ec;
  int c;
  TFlags<ActorFlag,_unsigned_int> local_e4;
  TFlags<ActorFlag,_unsigned_int> local_e0;
  TFlags<ActorFlag3,_unsigned_int> local_dc;
  TAngle<double> local_d8;
  TAngle<double> local_d0;
  FRenderStyle local_c4;
  double local_c0;
  double spriteYScale;
  double spriteXScale;
  FTextureID textureID;
  TAngle<double> local_a0;
  TAngle<double> local_98;
  TAngle<double> local_90;
  TAngle<double> local_88;
  DAngle angle_1;
  size_t spriteIndex;
  spritedef_t *sprite;
  int show;
  int rotation;
  spriteframe_t *frame;
  FTexture *texture;
  DVector3 pos;
  TAngle<double> local_38;
  DAngle angle;
  mpoint_t p;
  AActor *t;
  int iStack_10;
  int i;
  AMColor color;
  
  TAngle<double>::TAngle(&local_38);
  t._4_4_ = 0;
  do {
    if (numsectors <= t._4_4_) {
      return;
    }
    for (p.y = (double)sectors[t._4_4_].thinglist; p.y != 0.0; p.y = *(double *)((long)p.y + 0x38))
    {
      iVar1 = FIntCVar::operator_cast_to_int(&am_cheat);
      bVar5 = true;
      if (iVar1 < 1) {
        TFlags<ActorFlag6,_unsigned_int>::operator&
                  ((TFlags<ActorFlag6,_unsigned_int> *)((long)&pos.Z + 4),
                   SUB84(p.y,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&pos.Z + 4));
        bVar5 = uVar2 == 0;
      }
      if (bVar5) {
        AActor::PosRelative((DVector3 *)&texture,(AActor *)p.y,MapPortalGroup);
        angle.Degrees = (double)texture;
        p.x = pos.X;
        iVar1 = FIntCVar::operator_cast_to_int(&am_showthingsprites);
        if ((0 < iVar1) && (0 < *(int *)((long)p.y + 0xf0))) {
          frame = (spriteframe_t *)0x0;
          sprite._4_4_ = 0;
          for (sprite._0_4_ = FIntCVar::operator_cast_to_int(&am_showthingsprites);
              0 < (int)sprite && frame == (spriteframe_t *)0x0; sprite._0_4_ = (int)sprite + -1) {
            psVar3 = TArray<spritedef_t,_spritedef_t>::operator[]
                               (&sprites,(long)*(int *)((long)p.y + 0xf0));
            if ((int)sprite < 2) {
              local_124 = 0;
            }
            else {
              local_124 = (uint)*(byte *)((long)p.y + 0xf4);
            }
            angle_1.Degrees = (double)(long)(int)(psVar3->spriteframes + local_124);
            _show = TArray<spriteframe_t,_spriteframe_t>::operator[]
                              (&SpriteFrames,(size_t)angle_1.Degrees);
            TAngle<double>::TAngle(&local_90,(TAngle<double> *)((long)p.y + 0xb0));
            operator-(270.0,&local_88);
            bVar5 = FTextureID::operator!=(_show->Texture,_show->Texture + 1);
            if (bVar5) {
              TAngle<double>::operator+=(&local_88,11.25);
            }
            iVar1 = FIntCVar::operator_cast_to_int(&am_rotate);
            if ((iVar1 == 1) ||
               ((iVar1 = FIntCVar::operator_cast_to_int(&am_rotate), iVar1 == 2 &&
                ((viewactive & 1U) != 0)))) {
              TObjPtr<AActor>::operator->
                        ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
              TAngle<double>::operator-(&local_98,90.0);
              TAngle<double>::operator+=(&local_88,&local_98);
            }
            TAngle<double>::Normalized360((TAngle<double> *)&stack0xffffffffffffff58);
            TAngle<double>::operator*(&local_a0,0.044444444444444446);
            sprite._4_4_ = (int)local_a0.Degrees;
            local_134 = sprite._4_4_;
            if ((int)sprite < 3) {
              local_134 = 0;
            }
            spriteXScale._0_4_ = _show->Texture[local_134].texnum;
            spriteXScale._4_4_ = spriteXScale._0_4_;
            frame = (spriteframe_t *)FTextureManager::operator()(&TexMan,spriteXScale._0_4_,false);
          }
          if (frame != (spriteframe_t *)0x0) {
            spriteYScale = *(double *)((long)p.y + 0xf8) * 0.625 * scale_mtof;
            local_c0 = *(double *)((long)p.y + 0x100) * 0.625 * scale_mtof;
            local_c4 = LegacyRenderStyles[1];
            DrawMarker((FTexture *)frame,angle.Degrees,p.x,0,
                       (uint)(((uint)_show->Flip & 1 << ((byte)sprite._4_4_ & 0x1f)) != 0),
                       spriteYScale,local_c0,*(int *)((long)p.y + 0x3c0),1.0,0,LegacyRenderStyles[1]
                      );
            goto LAB_0042f433;
          }
        }
        TAngle<double>::operator=(&local_38,(TAngle<double> *)((long)p.y + 0xb0));
        iVar1 = FIntCVar::operator_cast_to_int(&am_rotate);
        if ((iVar1 == 1) ||
           ((iVar1 = FIntCVar::operator_cast_to_int(&am_rotate), iVar1 == 2 &&
            ((viewactive & 1U) != 0)))) {
          AM_rotatePoint(&angle.Degrees,&p.x);
          TObjPtr<AActor>::operator->
                    ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
          TAngle<double>::operator-(&local_d8);
          TAngle<double>::operator+(&local_d0,90.0);
          TAngle<double>::operator+=(&local_38,&local_d0);
        }
        pAVar4 = AMColorset::operator[](&AMColors,7);
        _iStack_10 = *pAVar4;
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_dc,
                   SUB84(p.y,0) + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG))
        ;
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_dc);
        bVar5 = false;
        if (uVar2 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_e0,
                     SUB84(p.y,0) +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e0);
          bVar5 = uVar2 == 0;
        }
        if (bVar5) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_e4,
                     SUB84(p.y,0) +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
          if (uVar2 == 0) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      ((TFlags<ActorFlag,_unsigned_int> *)&c,
                       SUB84(p.y,0) +
                       (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
            uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&c);
            if (uVar2 == 0) {
              pAVar4 = AMColorset::operator[](&AMColors,0xb);
              _iStack_10 = *pAVar4;
            }
            else {
              pAVar4 = AMColorset::operator[](&AMColors,10);
              _iStack_10 = *pAVar4;
            }
          }
          else {
            pAVar4 = AMColorset::operator[](&AMColors,0xc);
            _iStack_10 = *pAVar4;
          }
        }
        else {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_ec,
                     SUB84(p.y,0) +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_ec);
          if (uVar2 != 0) {
            bVar5 = DObject::IsKindOf((DObject *)p.y,AKey::RegistrationInfo.MyClass);
            if (bVar5) {
              iVar1 = G_SkillProperty(SKILLP_EasyKey);
              if (iVar1 == 0) {
                bVar5 = FBoolCVar::operator_cast_to_bool(&am_showkeys);
                if (bVar5) {
                  local_f0 = P_GetMapColorForKey((AInventory *)p.y);
                  if ((int)local_f0 < 0) {
                    pAVar4 = AMColorset::operator[](&AMColors,9);
                    _iStack_10 = *pAVar4;
                  }
                  else {
                    AMColor::FromRGB((AMColor *)&stack0xfffffffffffffff0,
                                     (int)local_f0 >> 0x10 & 0xff,(int)local_f0 >> 8 & 0xff,
                                     local_f0 & 0xff);
                  }
                  lineguy = TArray<mline_t,_mline_t>::operator[](&CheatKey,0);
                  uVar2 = TArray<mline_t,_mline_t>::Size(&CheatKey);
                  TAngle<double>::TAngle(&local_f8,0.0);
                  AM_drawLineCharacter
                            (lineguy,uVar2,0.0,&local_f8,(AMColor *)&stack0xfffffffffffffff0,
                             angle.Degrees,p.x);
                  iStack_10 = -1;
                }
                else {
                  pAVar4 = AMColorset::operator[](&AMColors,8);
                  _iStack_10 = *pAVar4;
                }
              }
              else {
                iStack_10 = -1;
              }
            }
            else {
              TFlags<ActorFlag,_unsigned_int>::operator&
                        (&local_fc,
                         SUB84(p.y,0) +
                         (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
              uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_fc);
              if (uVar2 == 0) {
                pAVar4 = AMColorset::operator[](&AMColors,8);
                _iStack_10 = *pAVar4;
              }
              else {
                pAVar4 = AMColorset::operator[](&AMColors,9);
                _iStack_10 = *pAVar4;
              }
            }
          }
        }
        if (iStack_10 != -1) {
          TAngle<double>::TAngle(&local_108,&local_38);
          AM_drawLineCharacter
                    (thintriangle_guy,3,16.0,&local_108,(AMColor *)&stack0xfffffffffffffff0,
                     angle.Degrees,p.x);
        }
        iVar1 = FIntCVar::operator_cast_to_int(&am_cheat);
        if ((iVar1 == 3) || (iVar1 = FIntCVar::operator_cast_to_int(&am_cheat), iVar1 == 6)) {
          scale = *(double *)((long)p.y + 0x178);
          TAngle<double>::TAngle(&local_118,(TAngle<double> *)((long)p.y + 0xb0));
          TAngle<double>::operator-(&local_110,&local_38);
          AM_drawLineCharacter
                    (AM_drawThings::box,4,scale,&local_110,(AMColor *)&stack0xfffffffffffffff0,
                     angle.Degrees,p.x);
        }
      }
LAB_0042f433:
    }
    t._4_4_ = t._4_4_ + 1;
  } while( true );
}

Assistant:

void AM_drawThings ()
{
	AMColor color;
	int		 i;
	AActor*	 t;
	mpoint_t p;
	DAngle	 angle;

	for (i=0;i<numsectors;i++)
	{
		t = sectors[i].thinglist;
		while (t)
		{
			if (am_cheat > 0 || !(t->flags6 & MF6_NOTONAUTOMAP))
			{
				DVector3 pos = t->PosRelative(MapPortalGroup);
				p.x = pos.X;
				p.y = pos.Y;

				if (am_showthingsprites > 0 && t->sprite > 0)
				{
					FTexture *texture = NULL;
					spriteframe_t *frame;
					int rotation = 0;

					// try all modes backwards until a valid texture has been found.	
					for(int show = am_showthingsprites; show > 0 && texture == NULL; show--)
					{
						const spritedef_t& sprite = sprites[t->sprite];
						const size_t spriteIndex = sprite.spriteframes + (show > 1 ? t->frame : 0);

						frame = &SpriteFrames[spriteIndex];
						DAngle angle = 270. -t->Angles.Yaw;
						if (frame->Texture[0] != frame->Texture[1]) angle += 180. / 16;
						if (am_rotate == 1 || (am_rotate == 2 && viewactive))
						{
							angle += players[consoleplayer].camera->Angles.Yaw - 90.;
						}
						rotation = int((angle.Normalized360() * (16. / 360.)).Degrees);

						const FTextureID textureID = frame->Texture[show > 2 ? rotation : 0];
						texture = TexMan(textureID);
					}

					if (texture == NULL) goto drawTriangle;	// fall back to standard display if no sprite can be found.

					const double spriteXScale = (t->Scale.X * (10. / 16.) * scale_mtof);
					const double spriteYScale = (t->Scale.Y * (10. / 16.) * scale_mtof);

					DrawMarker (texture, p.x, p.y, 0, !!(frame->Flip & (1 << rotation)),
						spriteXScale, spriteYScale, t->Translation, 1., 0, LegacyRenderStyles[STYLE_Normal]);
				}
				else
				{
			drawTriangle:
					angle = t->Angles.Yaw;

					if (am_rotate == 1 || (am_rotate == 2 && viewactive))
					{
						AM_rotatePoint (&p.x, &p.y);
						angle += -players[consoleplayer].camera->Angles.Yaw + 90.;
					}

					color = AMColors[AMColors.ThingColor];

					// use separate colors for special thing types
					if (t->flags3&MF3_ISMONSTER && !(t->flags&MF_CORPSE))
					{
						if (t->flags & MF_FRIENDLY) color = AMColors[AMColors.ThingColor_Friend];
						else if (!(t->flags & MF_COUNTKILL)) color = AMColors[AMColors.ThingColor_NocountMonster];
						else color = AMColors[AMColors.ThingColor_Monster];
					}
					else if (t->flags&MF_SPECIAL)
					{
						// Find the key's own color.
						// Only works correctly if single-key locks have lower numbers than any-key locks.
						// That is the case for all default keys, however.
						if (t->IsKindOf(RUNTIME_CLASS(AKey)))
						{
							if (G_SkillProperty(SKILLP_EasyKey))
							{
								// Already drawn by AM_drawKeys(), so don't draw again
								color.Index = -1;
							}
							else if (am_showkeys)
							{
								int P_GetMapColorForKey (AInventory * key);
								int c = P_GetMapColorForKey(static_cast<AKey *>(t));

								if (c >= 0)	color.FromRGB(RPART(c), GPART(c), BPART(c));
								else color = AMColors[AMColors.ThingColor_CountItem];
								AM_drawLineCharacter(&CheatKey[0], CheatKey.Size(), 0, 0., color, p.x, p.y);
								color.Index = -1;
							}
							else
							{
								color = AMColors[AMColors.ThingColor_Item];
							}
						}
						else if (t->flags&MF_COUNTITEM)
							color = AMColors[AMColors.ThingColor_CountItem];
						else
							color = AMColors[AMColors.ThingColor_Item];
					}

					if (color.Index != -1)
					{
						AM_drawLineCharacter(thintriangle_guy, NUMTHINTRIANGLEGUYLINES,	16, angle, color, p.x, p.y);
					}

					if (am_cheat == 3 || am_cheat == 6)
					{
						static const mline_t box[4] =
						{
							{ { -1, -1 }, {  1, -1 } },
							{ {  1, -1 }, {  1,  1 } },
							{ {  1,  1 }, { -1,  1 } },
							{ { -1,  1 }, { -1, -1 } },
						};

						AM_drawLineCharacter (box, 4, t->radius, angle - t->Angles.Yaw, color, p.x, p.y);
					}
				}
			}
			t = t->snext;
		}
	}
}